

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

uint8 * __thiscall
google::protobuf::UninterpretedOption::InternalSerializeWithCachedSizesToArray
          (UninterpretedOption *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  UninterpretedOption_NamePart *this_00;
  double dVar2;
  void *pvVar3;
  bool bVar4;
  uint8 *puVar5;
  uint8 *puVar6;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  int iVar11;
  
  iVar1 = (this->name_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar11 = 0;
    do {
      if (stream->end_ <= target) {
        target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
      }
      this_00 = (UninterpretedOption_NamePart *)
                ((this->name_).super_RepeatedPtrFieldBase.rep_)->elements[iVar11];
      *target = '\x12';
      uVar7 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar7 < 0x80) {
        target[1] = (byte)uVar7;
        puVar5 = target + 2;
      }
      else {
        target[1] = (byte)uVar7 | 0x80;
        if (uVar7 < 0x4000) {
          target[2] = (uint8)(uVar7 >> 7);
          puVar5 = target + 3;
        }
        else {
          puVar5 = target + 3;
          uVar7 = uVar7 >> 7;
          do {
            puVar6 = puVar5;
            puVar6[-1] = (byte)uVar7 | 0x80;
            uVar8 = uVar7 >> 7;
            puVar5 = puVar6 + 1;
            bVar4 = 0x3fff < uVar7;
            uVar7 = uVar8;
          } while (bVar4);
          *puVar6 = (uint8)uVar8;
        }
      }
      target = UninterpretedOption_NamePart::InternalSerializeWithCachedSizesToArray
                         (this_00,puVar5,stream);
      iVar11 = iVar11 + 1;
    } while (iVar11 != iVar1);
  }
  uVar7 = (this->_has_bits_).has_bits_[0];
  if ((uVar7 & 1) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,3,(this->identifier_value_).ptr_,target);
  }
  if ((uVar7 & 8) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = this->positive_int_value_;
    *target = ' ';
    if (uVar9 < 0x80) {
      target[1] = (byte)uVar9;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar9 | 0x80;
      if (uVar9 < 0x4000) {
        target[2] = (uint8)(uVar9 >> 7);
        target = target + 3;
      }
      else {
        target = target + 3;
        uVar9 = uVar9 >> 7;
        do {
          puVar5 = target;
          puVar5[-1] = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          target = puVar5 + 1;
          bVar4 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar4);
        *puVar5 = (uint8)uVar10;
      }
    }
  }
  if ((uVar7 & 0x10) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    uVar9 = this->negative_int_value_;
    *target = '(';
    if (uVar9 < 0x80) {
      target[1] = (byte)uVar9;
      target = target + 2;
    }
    else {
      target[1] = (byte)uVar9 | 0x80;
      if (uVar9 < 0x4000) {
        target[2] = (uint8)(uVar9 >> 7);
        target = target + 3;
      }
      else {
        target = target + 3;
        uVar9 = uVar9 >> 7;
        do {
          puVar5 = target;
          puVar5[-1] = (byte)uVar9 | 0x80;
          uVar10 = uVar9 >> 7;
          target = puVar5 + 1;
          bVar4 = 0x3fff < uVar9;
          uVar9 = uVar10;
        } while (bVar4);
        *puVar5 = (uint8)uVar10;
      }
    }
  }
  if ((uVar7 & 0x20) != 0) {
    if (stream->end_ <= target) {
      target = io::EpsCopyOutputStream::EnsureSpaceFallback(stream,target);
    }
    dVar2 = this->double_value_;
    *target = '1';
    *(double *)(target + 1) = dVar2;
    target = target + 9;
  }
  if ((uVar7 & 2) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,7,(this->string_value_).ptr_,target);
  }
  if ((uVar7 & 4) != 0) {
    target = io::EpsCopyOutputStream::WriteStringMaybeAliased
                       (stream,8,(this->aggregate_value_).ptr_,target);
  }
  pvVar3 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar3 & 1) != 0) {
    puVar5 = internal::WireFormat::InternalSerializeUnknownFieldsToArray
                       ((UnknownFieldSet *)((ulong)pvVar3 & 0xfffffffffffffffe),target,stream);
    return puVar5;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* UninterpretedOption::InternalSerializeWithCachedSizesToArray(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:google.protobuf.UninterpretedOption)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .google.protobuf.UninterpretedOption.NamePart name = 2;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_name_size()); i < n; i++) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessageToArray(2, this->_internal_name(i), target, stream);
  }

  cached_has_bits = _has_bits_[0];
  // optional string identifier_value = 3;
  if (cached_has_bits & 0x00000001u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_identifier_value().data(), static_cast<int>(this->_internal_identifier_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.identifier_value");
    target = stream->WriteStringMaybeAliased(
        3, this->_internal_identifier_value(), target);
  }

  // optional uint64 positive_int_value = 4;
  if (cached_has_bits & 0x00000008u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteUInt64ToArray(4, this->_internal_positive_int_value(), target);
  }

  // optional int64 negative_int_value = 5;
  if (cached_has_bits & 0x00000010u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteInt64ToArray(5, this->_internal_negative_int_value(), target);
  }

  // optional double double_value = 6;
  if (cached_has_bits & 0x00000020u) {
    stream->EnsureSpace(&target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::WriteDoubleToArray(6, this->_internal_double_value(), target);
  }

  // optional bytes string_value = 7;
  if (cached_has_bits & 0x00000002u) {
    target = stream->WriteBytesMaybeAliased(
        7, this->_internal_string_value(), target);
  }

  // optional string aggregate_value = 8;
  if (cached_has_bits & 0x00000004u) {
    ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::VerifyUTF8StringNamedField(
      this->_internal_aggregate_value().data(), static_cast<int>(this->_internal_aggregate_value().length()),
      ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::SERIALIZE,
      "google.protobuf.UninterpretedOption.aggregate_value");
    target = stream->WriteStringMaybeAliased(
        8, this->_internal_aggregate_value(), target);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields(), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:google.protobuf.UninterpretedOption)
  return target;
}